

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_wait(Spi *this)

{
  byte bVar1;
  int __c;
  int iVar2;
  uint8_t data [2];
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  if (this->verbose == true) {
    fwrite("waiting..",9,1,_stderr);
  }
  iVar2 = 0;
  do {
    data[0] = '\x05';
    data[1] = '\0';
    flash_chip_select(this);
    xfer_spi(this,data,2);
    flash_chip_deselect(this);
    if (((ushort)data & 0x100) == 0) {
      if (1 < iVar2) {
        bVar1 = this->verbose;
        if ((bool)bVar1 == true) {
          fputc(0x52,_stderr);
          fflush(_stderr);
          bVar1 = this->verbose;
        }
        if ((bVar1 & 1) != 0) {
          fputc(10,_stderr);
        }
        return;
      }
      iVar2 = iVar2 + 1;
      __c = 0x72;
      if (this->verbose != false) {
LAB_00112fa7:
        fputc(__c,_stderr);
        fflush(_stderr);
      }
    }
    else {
      iVar2 = 0;
      __c = 0x2e;
      if (this->verbose == true) goto LAB_00112fa7;
    }
    local_38.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  } while( true );
}

Assistant:

void Spi::flash_wait() {
	if (verbose)
		fprintf(stderr, "waiting..");

	int count = 0;
	while (1) {
		uint8_t data[2] = { FC_RSR1 };

		flash_chip_select();
		xfer_spi(data, 2);
		flash_chip_deselect();

		if ((data[1] & 0x01) == 0) {
			if (count < 2) {
				count++;
				if (verbose) {
					fprintf(stderr, "r");
					fflush(stderr);
				}
			} else {
				if (verbose) {
					fprintf(stderr, "R");
					fflush(stderr);
				}
				break;
			}
		} else {
			if (verbose) {
				fprintf(stderr, ".");
				fflush(stderr);
			}
			count = 0;
		}

		std::this_thread::sleep_for(std::chrono::milliseconds(1));
	}

	if (verbose)
		fprintf(stderr, "\n");

}